

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

type_conflict1 __thiscall chaiscript::parse_num<double>(chaiscript *this,string_view t_str)

{
  char cVar1;
  const_iterator pvVar2;
  double local_68;
  value_type c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  double dStack_30;
  int exponent;
  double decimal_place;
  double base;
  double t;
  string_view t_str_local;
  
  t_str_local._M_len = t_str._M_len;
  base = 0.0;
  decimal_place = 0.0;
  dStack_30 = 0.0;
  __range2._4_4_ = 0;
  t = (double)this;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&t);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&t);
  for (; __end2 != pvVar2; __end2 = __end2 + 1) {
    cVar1 = *__end2;
    switch(cVar1) {
    case '+':
      break;
    default:
      break;
    case '-':
      __range2._4_4_ = -1;
      break;
    case '.':
      dStack_30 = 10.0;
      break;
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      if (10.0 <= dStack_30) {
        base = (double)(cVar1 + -0x30) / dStack_30 + base;
        dStack_30 = dStack_30 * 10.0;
      }
      else {
        base = (double)(cVar1 + -0x30) + base * 10.0;
      }
      break;
    case 'E':
    case 'e':
      __range2._4_4_ = 1;
      dStack_30 = 0.0;
      decimal_place = base;
      base = 0.0;
    }
  }
  if (__range2._4_4_ == 0) {
    local_68 = base;
  }
  else {
    local_68 = pow(10.0,base * (double)__range2._4_4_);
    local_68 = decimal_place * local_68;
  }
  return local_68;
}

Assistant:

[[nodiscard]] auto parse_num(const std::string_view t_str) -> typename std::enable_if<!std::is_integral<T>::value, T>::type {
    T t = 0;
    T base{};
    T decimal_place = 0;
    int exponent = 0;

    for (const auto c : t_str) {
      switch (c) {
        case '.':
          decimal_place = 10;
          break;
        case 'e':
        case 'E':
          exponent = 1;
          decimal_place = 0;
          base = t;
          t = 0;
          break;
        case '-':
          exponent = -1;
          break;
        case '+':
          break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
          if (decimal_place < 10) {
            t *= 10;
            t += static_cast<T>(c - '0');
          } else {
            t += static_cast<T>(c - '0') / decimal_place;
            decimal_place *= 10;
          }
          break;
        default:
          break;
      }
    }
    return exponent ? base * std::pow(T(10), t * static_cast<T>(exponent)) : t;
  }